

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_921bba::FileSetType::WriteProperties<cmValue>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,cmValue value,
          Action action)

{
  cmMakefile *pcVar1;
  string_view fileSetType;
  string_view sVar2;
  string *psVar3;
  cmTargetInternals *pcVar4;
  bool bVar5;
  ulong uVar6;
  string local_298;
  string_view local_278;
  size_t local_268;
  char *pcStack_260;
  cmValue local_250;
  string local_248;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName_1;
  string local_1e8;
  string_view local_1c8;
  size_t local_1b8;
  char *pcStack_1b0;
  cmValue local_1a0;
  string local_198;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  allocator<char> local_109;
  string local_108;
  size_t local_e8;
  char *local_e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d8;
  size_t local_c8;
  char *pcStack_c0;
  size_t local_b8;
  char *pcStack_b0;
  FileSetType *local_a0;
  allocator<char> local_81;
  string local_80;
  size_t local_60;
  char *local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  Action local_3c;
  string *psStack_38;
  Action action_local;
  string *prop_local;
  cmTargetInternals *impl_local;
  cmTarget *tgt_local;
  FileSetType *this_local;
  cmValue value_local;
  
  local_3c = action;
  psStack_38 = prop;
  prop_local = (string *)impl;
  impl_local = (cmTargetInternals *)tgt;
  tgt_local = (cmTarget *)this;
  this_local = (FileSetType *)value.Value;
  local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  local_60 = (this->DefaultDirectoryProperty).super_string_view._M_len;
  local_58 = (this->DefaultDirectoryProperty).super_string_view._M_str;
  bVar5 = std::operator==(local_50,(this->DefaultDirectoryProperty).super_string_view);
  pcVar4 = impl_local;
  psVar3 = prop_local;
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_80,&this->TypeName,&local_81);
    local_a0 = this_local;
    local_b8 = (this->TypeName).super_string_view._M_len;
    pcStack_b0 = (this->TypeName).super_string_view._M_str;
    local_c8 = (this->DefaultDescription).super_string_view._M_len;
    pcStack_c0 = (this->DefaultDescription).super_string_view._M_str;
    cmTargetInternals::AddDirectoryToFileSet<cmValue>
              ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,&local_80,(cmValue)this_local,
               (this->TypeName).super_string_view,(this->DefaultDescription).super_string_view,
               local_3c);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    value_local.Value._7_1_ = 1;
  }
  else {
    local_d8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38);
    local_e8 = (this->DefaultPathProperty).super_string_view._M_len;
    local_e0 = (this->DefaultPathProperty).super_string_view._M_str;
    bVar5 = std::operator==(local_d8,(this->DefaultPathProperty).super_string_view);
    pcVar4 = impl_local;
    psVar3 = prop_local;
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_108,&this->TypeName,&local_109);
      cmTargetInternals::AddPathToFileSet<cmValue>
                ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,&local_108,(cmValue)this_local,
                 (this->TypeName).super_string_view,(this->DefaultDescription).super_string_view,
                 local_3c);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      value_local.Value._7_1_ = 1;
    }
    else {
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38);
      fileSetName.field_2._8_8_ = (this->DirectoryPrefix).super_string_view._M_len;
      bVar5 = cmHasPrefix(sVar2,(this->DirectoryPrefix).super_string_view);
      psVar3 = psStack_38;
      if (bVar5) {
        std::basic_string_view<char,_std::char_traits<char>_>::size
                  (&(this->DirectoryPrefix).super_string_view);
        std::__cxx11::string::substr((ulong)local_178,(ulong)psVar3);
        uVar6 = std::__cxx11::string::empty();
        pcVar4 = impl_local;
        psVar3 = prop_local;
        if ((uVar6 & 1) == 0) {
          local_1a0.Value = (string *)this_local;
          local_1b8 = (this->TypeName).super_string_view._M_len;
          pcStack_1b0 = (this->TypeName).super_string_view._M_str;
          cmStrCat<cm::static_string_view_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (&local_1e8,&this->ArbitraryDescription,(char (*) [3])0x112d6c1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     (char (*) [2])0x11593aa);
          local_1c8 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1e8)
          ;
          sVar2._M_str = pcStack_1b0;
          sVar2._M_len = local_1b8;
          cmTargetInternals::AddDirectoryToFileSet<cmValue>
                    ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,(string *)local_178,local_1a0,
                     sVar2,local_1c8,local_3c);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        else {
          pcVar1 = (cmMakefile *)prop_local->_M_string_length;
          cmStrCat<cm::static_string_view_const&,char_const(&)[23]>
                    (&local_198,&this->ArbitraryDescription,(char (*) [23])" name cannot be empty.")
          ;
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
        }
        value_local.Value._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_178);
      }
      else {
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38);
        fileSetName_1.field_2._8_8_ = (this->PathPrefix).super_string_view._M_len;
        bVar5 = cmHasPrefix(sVar2,(this->PathPrefix).super_string_view);
        psVar3 = psStack_38;
        if (bVar5) {
          std::basic_string_view<char,_std::char_traits<char>_>::size
                    (&(this->PathPrefix).super_string_view);
          std::__cxx11::string::substr((ulong)local_228,(ulong)psVar3);
          uVar6 = std::__cxx11::string::empty();
          pcVar4 = impl_local;
          psVar3 = prop_local;
          if ((uVar6 & 1) == 0) {
            local_250.Value = (string *)this_local;
            local_268 = (this->TypeName).super_string_view._M_len;
            pcStack_260 = (this->TypeName).super_string_view._M_str;
            cmStrCat<cm::static_string_view_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                      (&local_298,&this->ArbitraryDescription,(char (*) [3])0x112d6c1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,(char (*) [2])0x11593aa);
            local_278 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_298);
            fileSetType._M_str = pcStack_260;
            fileSetType._M_len = local_268;
            cmTargetInternals::AddPathToFileSet<cmValue>
                      ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,(string *)local_228,local_250,
                       fileSetType,local_278,local_3c);
            std::__cxx11::string::~string((string *)&local_298);
          }
          else {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            cmStrCat<cm::static_string_view_const&,char_const(&)[23]>
                      (&local_248,&this->ArbitraryDescription,
                       (char (*) [23])" name cannot be empty.");
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_248);
            std::__cxx11::string::~string((string *)&local_248);
          }
          value_local.Value._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_228);
        }
        else {
          value_local.Value._7_1_ = 0;
        }
      }
    }
  }
  return (bool)(value_local.Value._7_1_ & 1);
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  Action action)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                action);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, action);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""),
        action);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""),
        action);
    }
    return true;
  }
  return false;
}